

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismExtend.cpp
# Opt level: O3

int pztopology::Pr<pztopology::Pr<pztopology::TPZPoint>_>::SideNodeLocId(int side,int node)

{
  int iVar1;
  ostream *poVar2;
  long *plVar3;
  int iVar4;
  uint side_00;
  char local_19;
  
  side_00 = side;
  if (side + 2U < 5) {
LAB_00d97134:
    iVar1 = Pr<pztopology::TPZPoint>::SideNodeLocId(side_00,node);
    return iVar1;
  }
  side_00 = side - 3;
  if (2 < side_00) {
    side_00 = side % 3;
    iVar4 = (1 < (int)side_00) + 1;
    iVar1 = node / iVar4;
    if (iVar1 != 1) {
      if (iVar1 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Pr<TFather>::SideNodeLocId inconsistent side or node ",
                   0x35);
        poVar2 = (ostream *)std::ostream::operator<<(&std::cerr,side);
        local_19 = ' ';
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_19,1);
        plVar3 = (long *)std::ostream::operator<<(poVar2,node);
        std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
        std::ostream::put((char)plVar3);
        std::ostream::flush();
        return -1;
      }
      goto LAB_00d97134;
    }
    node = node - iVar4;
  }
  iVar1 = Pr<pztopology::TPZPoint>::SideNodeLocId(side_00,node);
  return iVar1 + 2;
}

Assistant:

int Pr<TFather>::SideNodeLocId(int side, int node)
	{
		int ftns = side/TFather::NSides;
		int fatherside = side%TFather::NSides;
		if(ftns == 0) return TFather::SideNodeLocId(side,node);
		if(ftns == 1) return TFather::SideNodeLocId(side-TFather::NSides,node)+TFather::NCornerNodes;
		int fatherlevel = node/TFather::NSideNodes(fatherside);
		if(fatherlevel == 0) return TFather::SideNodeLocId(fatherside,node);
		if(fatherlevel == 1) return TFather::SideNodeLocId(fatherside,node-TFather::NSideNodes(fatherside))+TFather::NCornerNodes;//TFather::NSideNodes(fatherside);
		PZError << "Pr<TFather>::SideNodeLocId inconsistent side or node " << side
		<< ' ' << node << endl;
		return -1;
	}